

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O3

int handle_datagram_frame(quicly_conn_t *conn,st_quicly_handle_payload_state_t *state)

{
  uint8_t *end;
  st_quicly_receive_datagram_frame_t *psVar1;
  uint64_t uVar2;
  uint8_t *puVar3;
  int iVar4;
  ptls_iovec_t pVar5;
  
  iVar4 = 0x20007;
  if ((((conn->super).ctx)->transport_params).max_datagram_frame_size != 0) {
    end = state->end;
    if (state->frame_type == 0x31) {
      uVar2 = ptls_decode_quicint(&state->src,end);
      if (uVar2 == 0xffffffffffffffff) {
        return 0x20007;
      }
      puVar3 = state->src;
      if ((ulong)((long)end - (long)puVar3) < uVar2) {
        return 0x20007;
      }
    }
    else {
      puVar3 = state->src;
      uVar2 = (long)end - (long)puVar3;
    }
    state->src = puVar3 + uVar2;
    psVar1 = ((conn->super).ctx)->receive_datagram_frame;
    pVar5.len = uVar2;
    pVar5.base = puVar3;
    (*psVar1->cb)(psVar1,conn,pVar5);
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

static int handle_datagram_frame(quicly_conn_t *conn, struct st_quicly_handle_payload_state_t *state)
{
    quicly_datagram_frame_t frame;
    int ret;

    /* check if we advertised support for DATAGRAM frames on this connection */
    if (conn->super.ctx->transport_params.max_datagram_frame_size == 0)
        return QUICLY_TRANSPORT_ERROR_FRAME_ENCODING;

    /* decode the frame */
    if ((ret = quicly_decode_datagram_frame(state->frame_type, &state->src, state->end, &frame)) != 0)
        return ret;
    QUICLY_PROBE(DATAGRAM_RECEIVE, conn, conn->stash.now, frame.payload.base, frame.payload.len);

    /* handle the frame. Applications might call quicly_close or other functions that modify the connection state. */
    conn->super.ctx->receive_datagram_frame->cb(conn->super.ctx->receive_datagram_frame, conn, frame.payload);

    return 0;
}